

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::basisSolveInterface
          (Highs *this,vector<double,_std::allocator<double>_> *rhs,double *solution_vector,
          HighsInt *solution_num_nz,HighsInt *solution_indices,bool transpose)

{
  const_reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RCX;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  HVectorBase<double> *in_RDI;
  long in_R8;
  byte in_R9B;
  HighsInt iRow_6;
  HighsInt iX_1;
  HighsInt iRow_5;
  HighsInt iRow_4;
  HighsInt iRow_3;
  HighsInt iX;
  HighsInt iRow_2;
  HighsInt iRow_1;
  double expected_density;
  HighsInt iRow;
  HighsInt rhs_num_nz;
  HVector solve_vector;
  HighsInt num_row;
  HighsLp *lp;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  HEkk *in_stack_fffffffffffffeb0;
  HighsInt size_;
  int local_134;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar4;
  int local_124;
  int local_120;
  int local_11c;
  int local_10c;
  int local_108;
  undefined1 local_f8 [4];
  int local_f4;
  vector<int,_std::allocator<int>_> vStack_f0;
  vector<double,_std::allocator<double>_> avStack_d8 [6];
  int local_44;
  pointer *local_40;
  undefined4 local_38;
  byte local_31;
  long local_30;
  int *local_28;
  long local_20;
  vector<double,_std::allocator<double>_> *local_18;
  HighsStatus local_4;
  
  local_31 = in_R9B & 1;
  local_38 = 0;
  local_40 = &in_RDI[1].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_44 = *(int *)((long)&in_RDI[1].packIndex.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 4);
  if (local_44 == 0) {
    local_4 = kOk;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    HEkk::setNlaPointersForLpAndScale
              (in_stack_fffffffffffffeb0,
               (HighsLp *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    size_ = (HighsInt)((ulong)local_f8 >> 0x20);
    HVectorBase<double>::HVectorBase((HVectorBase<double> *)in_stack_fffffffffffffeb0);
    HVectorBase<double>::setup(in_RDI,size_);
    HVectorBase<double>::clear
              ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))
    ;
    local_108 = 0;
    for (local_10c = 0; local_10c < local_44; local_10c = local_10c + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_10c);
      if ((*pvVar1 != 0.0) || (NAN(*pvVar1))) {
        in_stack_fffffffffffffeac = local_10c;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_f0,(long)local_108);
        *pvVar2 = in_stack_fffffffffffffeac;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_10c);
        in_stack_fffffffffffffeb0 = (HEkk *)*pvVar1;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (avStack_d8,(long)local_10c);
        *pvVar3 = (value_type)in_stack_fffffffffffffeb0;
        local_108 = local_108 + 1;
      }
    }
    local_f4 = local_108;
    if ((local_31 & 1) == 0) {
      HEkk::ftran(in_stack_fffffffffffffeb0,
                  (HVector *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  2.52096205285463e-317);
    }
    else {
      HEkk::btran(in_stack_fffffffffffffeb0,
                  (HVector *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  2.52094525462267e-317);
    }
    if (local_30 == 0) {
      if (local_44 < local_f4) {
        for (local_11c = 0; local_11c < local_44; local_11c = local_11c + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (avStack_d8,(long)local_11c);
          *(value_type *)(local_20 + (long)local_11c * 8) = *pvVar3;
        }
      }
      else {
        for (local_120 = 0; local_120 < local_44; local_120 = local_120 + 1) {
          *(undefined8 *)(local_20 + (long)local_120 * 8) = 0;
        }
        for (local_124 = 0; local_124 < local_f4; local_124 = local_124 + 1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_f0,(long)local_124);
          iVar4 = *pvVar2;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_d8,(long)iVar4);
          *(value_type *)(local_20 + (long)iVar4 * 8) = *pvVar3;
        }
      }
    }
    else if (local_44 < local_f4) {
      local_28 = (int *)0x0;
      for (iVar4 = 0; iVar4 < local_44; iVar4 = iVar4 + 1) {
        *(undefined8 *)(local_20 + (long)iVar4 * 8) = 0;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_d8,(long)iVar4);
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_d8,(long)iVar4);
          *(value_type *)(local_20 + (long)iVar4 * 8) = *pvVar3;
          *(int *)(local_30 + (long)*local_28 * 4) = iVar4;
          local_28 = local_28 + 1;
        }
      }
    }
    else {
      for (iVar4 = 0; iVar4 < local_44; iVar4 = iVar4 + 1) {
        *(undefined8 *)(local_20 + (long)iVar4 * 8) = 0;
      }
      for (local_134 = 0; local_134 < local_f4; local_134 = local_134 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_f0,(long)local_134);
        iVar4 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_d8,(long)iVar4);
        *(value_type *)(local_20 + (long)iVar4 * 8) = *pvVar3;
        *(int *)(local_30 + (long)local_134 * 4) = iVar4;
      }
      *local_28 = local_f4;
    }
    local_4 = kOk;
    HVectorBase<double>::~HVectorBase((HVectorBase<double> *)in_stack_fffffffffffffeb0);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::basisSolveInterface(const vector<double>& rhs,
                                       double* solution_vector,
                                       HighsInt* solution_num_nz,
                                       HighsInt* solution_indices,
                                       bool transpose) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  // For an LP with no rows the solution is vacuous
  if (num_row == 0) return return_status;
  // EKK must have an INVERT, but simplex NLA may need the pointer to
  // its LP to be refreshed so that it can use its scale factors
  assert(ekk_instance_.status_.has_invert);
  // Reset the simplex NLA LP and scale pointers for the unscaled LP
  ekk_instance_.setNlaPointersForLpAndScale(lp);
  assert(!lp.is_moved_);
  // Set up solve vector with suitably scaled RHS
  HVector solve_vector;
  solve_vector.setup(num_row);
  solve_vector.clear();
  HighsInt rhs_num_nz = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (rhs[iRow]) {
      solve_vector.index[rhs_num_nz++] = iRow;
      solve_vector.array[iRow] = rhs[iRow];
    }
  }
  solve_vector.count = rhs_num_nz;
  //
  // Note that solve_vector.count is just used to determine whether
  // hyper-sparse solves should be used. The indices of the nonzeros
  // in the solution are always accumulated. There's no switch (such
  // as setting solve_vector.count = num_row+1) to not do this.
  //
  // Get expected_density from analysis during simplex solve.
  const double expected_density = 1;
  if (transpose) {
    ekk_instance_.btran(solve_vector, expected_density);
  } else {
    ekk_instance_.ftran(solve_vector, expected_density);
  }
  // Extract the solution
  if (solution_indices == NULL) {
    // Nonzeros in the solution not required
    if (solve_vector.count > num_row) {
      // Solution nonzeros not known
      for (HighsInt iRow = 0; iRow < num_row; iRow++) {
        solution_vector[iRow] = solve_vector.array[iRow];
      }
    } else {
      // Solution nonzeros are known
      for (HighsInt iRow = 0; iRow < num_row; iRow++) solution_vector[iRow] = 0;
      for (HighsInt iX = 0; iX < solve_vector.count; iX++) {
        HighsInt iRow = solve_vector.index[iX];
        solution_vector[iRow] = solve_vector.array[iRow];
      }
    }
  } else {
    // Nonzeros in the solution are required
    if (solve_vector.count > num_row) {
      // Solution nonzeros not known
      solution_num_nz = 0;
      for (HighsInt iRow = 0; iRow < num_row; iRow++) {
        solution_vector[iRow] = 0;
        if (solve_vector.array[iRow]) {
          solution_vector[iRow] = solve_vector.array[iRow];
          solution_indices[*solution_num_nz++] = iRow;
        }
      }
    } else {
      // Solution nonzeros are known
      for (HighsInt iRow = 0; iRow < num_row; iRow++) solution_vector[iRow] = 0;
      for (HighsInt iX = 0; iX < solve_vector.count; iX++) {
        HighsInt iRow = solve_vector.index[iX];
        solution_vector[iRow] = solve_vector.array[iRow];
        solution_indices[iX] = iRow;
      }
      *solution_num_nz = solve_vector.count;
    }
  }
  return HighsStatus::kOk;
}